

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O0

void grd_spdopsi(grd_st_t *grd_st,seq_t *seq)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint *in_RSI;
  long *in_RDI;
  uint64_t o_1;
  uint32_t n_1;
  double sum_1;
  uint32_t yp;
  uint32_t nnz;
  uint32_t y_1;
  pos_t *pos_1;
  uint32_t t_1;
  uint32_t off;
  uint64_t o;
  uint32_t n;
  double sum;
  uint32_t y;
  pos_t *pos;
  uint32_t t;
  uint32_t *psioff;
  uint32_t_0__0_ *psiidx;
  uint32_t *psiyp;
  double *psival;
  double_0__0_ *psiuni;
  uint32_t T;
  uint32_t Y;
  double *x;
  mdl_t *mdl;
  uint64_t in_stack_00000140;
  double in_stack_00000148;
  double *in_stack_00000150;
  double *in_stack_00000158;
  uint local_ac;
  double local_a8;
  uint local_9c;
  int local_98;
  uint local_94;
  uint local_88;
  uint local_84;
  uint local_74;
  double local_70;
  uint local_64;
  uint local_54;
  
  lVar3 = *in_RDI;
  lVar4 = *(long *)(lVar3 + 0x38);
  uVar1 = *(uint *)(lVar3 + 0xc);
  uVar2 = *in_RSI;
  lVar5 = in_RDI[5];
  lVar6 = in_RDI[4];
  lVar7 = in_RDI[6];
  lVar8 = in_RDI[7];
  lVar9 = in_RDI[8];
  for (local_54 = 0; local_54 < uVar2; local_54 = local_54 + 1) {
    for (local_64 = 0; local_64 < uVar1; local_64 = local_64 + 1) {
      local_70 = 0.0;
      for (local_74 = 0; local_74 < in_RSI[(ulong)local_54 * 8 + 5]; local_74 = local_74 + 1) {
        local_70 = *(double *)
                    (lVar4 + (*(long *)(*(long *)(lVar3 + 0x28) +
                                       *(long *)(*(long *)(in_RSI + (ulong)local_54 * 8 + 8) +
                                                (ulong)local_74 * 8) * 8) + (ulong)local_64) * 8) +
                   local_70;
      }
      *(double *)(lVar5 + (ulong)local_54 * (ulong)uVar1 * 8 + (ulong)local_64 * 8) = local_70;
    }
  }
  local_84 = 0;
  for (local_88 = 1; local_88 < uVar2; local_88 = local_88 + 1) {
    *(uint *)(lVar9 + (ulong)local_88 * 4) = local_84;
    local_98 = 0;
    for (local_94 = 0; local_94 < uVar1; local_94 = local_94 + 1) {
      for (local_9c = 0; local_9c < uVar1; local_9c = local_9c + 1) {
        local_a8 = 0.0;
        for (local_ac = 0; local_ac < in_RSI[(ulong)local_88 * 8 + 6]; local_ac = local_ac + 1) {
          local_a8 = *(double *)
                      (lVar4 + (*(long *)(*(long *)(lVar3 + 0x30) +
                                         *(long *)(*(long *)(in_RSI + (ulong)local_88 * 8 + 10) +
                                                  (ulong)local_ac * 8) * 8) +
                                (ulong)(local_9c * uVar1) + (ulong)local_94) * 8) + local_a8;
        }
        if ((local_a8 != 0.0) || (NAN(local_a8))) {
          *(uint *)(lVar7 + (ulong)local_84 * 4) = local_9c;
          *(double *)(lVar6 + (ulong)local_84 * 8) = local_a8;
          local_98 = local_98 + 1;
          local_84 = local_84 + 1;
        }
      }
      *(int *)(lVar8 + (ulong)local_88 * (ulong)uVar1 * 4 + (ulong)local_94 * 4) = local_98;
    }
  }
  xvm_expma(in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140);
  xvm_expma(in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140);
  return;
}

Assistant:

void grd_spdopsi(grd_st_t *grd_st, const seq_t *seq) {
	const mdl_t *mdl = grd_st->mdl;
	const double  *x = mdl->theta;
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	double   (*psiuni)[T][Y] = (void *)grd_st->psiuni;
	double    *psival        =         grd_st->psi;
	uint32_t  *psiyp         =         grd_st->psiyp;
	uint32_t (*psiidx)[T][Y] = (void *)grd_st->psiidx;
	uint32_t  *psioff        =         grd_st->psioff;
	for (uint32_t t = 0; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t y = 0; y < Y; y++) {
			double sum = 0.0;
			for (uint32_t n = 0; n < pos->ucnt; n++) {
				const uint64_t o = pos->uobs[n];
				sum += x[mdl->uoff[o] + y];
			}
			(*psiuni)[t][y] = sum;
		}
	}
	uint32_t off = 0;
	for (uint32_t t = 1; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		psioff[t] = off;
		for (uint32_t y = 0, nnz = 0; y < Y; y++) {
			for (uint32_t yp = 0; yp < Y; yp++) {
				double sum = 0.0;
				for (uint32_t n = 0; n < pos->bcnt; n++) {
					const uint64_t o = pos->bobs[n];
					sum += x[mdl->boff[o] + yp * Y + y];
				}
				if (sum == 0.0)
					continue;
				psiyp [off] = yp;
				psival[off] = sum;
				nnz++, off++;
			}
			(*psiidx)[t][y] = nnz;
		}
	}
	xvm_expma((double *)psiuni, (double *)psiuni, 0.0, (uint64_t)T * Y);
	xvm_expma((double *)psival, (double *)psival, 1.0, off);
}